

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined4 uVar88;
  undefined1 auVar89 [32];
  undefined4 uVar90;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  bool bVar104;
  int iVar105;
  ulong uVar106;
  long lVar107;
  ulong uVar108;
  long lVar109;
  uint uVar110;
  ulong uVar111;
  ulong uVar112;
  ulong uVar113;
  ulong *puVar114;
  ulong uVar115;
  undefined4 uVar116;
  ulong unaff_R12;
  size_t mask;
  ulong uVar117;
  ulong uVar118;
  ulong uVar119;
  bool bVar120;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar123;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [64];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar144;
  float fVar145;
  undefined1 auVar143 [64];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  float fVar155;
  undefined1 auVar156 [32];
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar157 [64];
  undefined1 auVar164 [32];
  uint uVar166;
  uint uVar167;
  uint uVar168;
  uint uVar169;
  uint uVar170;
  uint uVar171;
  uint uVar172;
  undefined1 auVar165 [64];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  float fVar175;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar176 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  MoellerTrumboreHitM<8,_embree::avx::UVIdentity<8>_> hit;
  NodeRef stack [564];
  int local_166c;
  ulong local_1668;
  ulong local_1660;
  ulong local_1658;
  ulong local_1650;
  Scene *local_1648;
  undefined1 local_1640 [32];
  Geometry *local_1620;
  ulong local_1618;
  ulong local_1610;
  ulong local_1608;
  float local_1600;
  float local_15fc;
  float local_15f8;
  float local_15f4;
  float local_15f0;
  undefined4 local_15ec;
  uint local_15e8;
  uint local_15e4;
  uint local_15e0;
  RTCFilterFunctionNArguments local_15d0;
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [8];
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  undefined4 uStack_13e4;
  undefined1 local_13e0 [32];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [32];
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  undefined4 uStack_1204;
  ulong local_1200;
  ulong local_11f8 [569];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar123 = ray->tfar;
    if (0.0 <= fVar123) {
      puVar114 = local_11f8;
      aVar2 = (ray->dir).field_0;
      auVar8 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar140._8_4_ = 0x7fffffff;
      auVar140._0_8_ = 0x7fffffff7fffffff;
      auVar140._12_4_ = 0x7fffffff;
      auVar140 = vandps_avx((undefined1  [16])aVar2,auVar140);
      auVar146._8_4_ = 0x219392ef;
      auVar146._0_8_ = 0x219392ef219392ef;
      auVar146._12_4_ = 0x219392ef;
      auVar140 = vcmpps_avx(auVar140,auVar146,1);
      auVar140 = vblendvps_avx((undefined1  [16])aVar2,auVar146,auVar140);
      auVar146 = vrcpps_avx(auVar140);
      fVar129 = auVar146._0_4_;
      auVar137._0_4_ = fVar129 * auVar140._0_4_;
      fVar130 = auVar146._4_4_;
      auVar137._4_4_ = fVar130 * auVar140._4_4_;
      fVar131 = auVar146._8_4_;
      auVar137._8_4_ = fVar131 * auVar140._8_4_;
      fVar132 = auVar146._12_4_;
      auVar137._12_4_ = fVar132 * auVar140._12_4_;
      auVar147._8_4_ = 0x3f800000;
      auVar147._0_8_ = &DAT_3f8000003f800000;
      auVar147._12_4_ = 0x3f800000;
      auVar140 = vsubps_avx(auVar147,auVar137);
      uVar116 = *(undefined4 *)&(ray->org).field_0;
      local_1440._4_4_ = uVar116;
      local_1440._0_4_ = uVar116;
      local_1440._8_4_ = uVar116;
      local_1440._12_4_ = uVar116;
      local_1440._16_4_ = uVar116;
      local_1440._20_4_ = uVar116;
      local_1440._24_4_ = uVar116;
      local_1440._28_4_ = uVar116;
      auVar152 = ZEXT3264(local_1440);
      uVar116 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1460._4_4_ = uVar116;
      local_1460._0_4_ = uVar116;
      local_1460._8_4_ = uVar116;
      local_1460._12_4_ = uVar116;
      local_1460._16_4_ = uVar116;
      local_1460._20_4_ = uVar116;
      local_1460._24_4_ = uVar116;
      local_1460._28_4_ = uVar116;
      auVar154 = ZEXT3264(local_1460);
      uVar116 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1480._4_4_ = uVar116;
      local_1480._0_4_ = uVar116;
      local_1480._8_4_ = uVar116;
      local_1480._12_4_ = uVar116;
      local_1480._16_4_ = uVar116;
      local_1480._20_4_ = uVar116;
      local_1480._24_4_ = uVar116;
      local_1480._28_4_ = uVar116;
      auVar157 = ZEXT3264(local_1480);
      auVar138._0_4_ = fVar129 + fVar129 * auVar140._0_4_;
      auVar138._4_4_ = fVar130 + fVar130 * auVar140._4_4_;
      auVar138._8_4_ = fVar131 + fVar131 * auVar140._8_4_;
      auVar138._12_4_ = fVar132 + fVar132 * auVar140._12_4_;
      local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar140 = vshufps_avx(auVar138,auVar138,0);
      local_14a0._16_16_ = auVar140;
      local_14a0._0_16_ = auVar140;
      auVar165 = ZEXT3264(local_14a0);
      auVar140 = vmovshdup_avx(auVar138);
      auVar146 = vshufps_avx(auVar138,auVar138,0x55);
      local_14c0._16_16_ = auVar146;
      local_14c0._0_16_ = auVar146;
      auVar174 = ZEXT3264(local_14c0);
      auVar146 = vshufpd_avx(auVar138,auVar138,1);
      auVar137 = vshufps_avx(auVar138,auVar138,0xaa);
      local_14e0._16_16_ = auVar137;
      local_14e0._0_16_ = auVar137;
      auVar139 = ZEXT3264(local_14e0);
      uVar115 = (ulong)(auVar138._0_4_ < 0.0) << 5;
      local_1610 = (ulong)(auVar140._0_4_ < 0.0) << 5 | 0x40;
      uVar112 = (ulong)(auVar146._0_4_ < 0.0) << 5 | 0x80;
      uVar113 = uVar115 ^ 0x20;
      uVar119 = local_1610 ^ 0x20;
      uVar108 = uVar112 ^ 0x20;
      auVar140 = vshufps_avx(auVar8,auVar8,0);
      local_1500._16_16_ = auVar140;
      local_1500._0_16_ = auVar140;
      auVar143 = ZEXT3264(local_1500);
      auVar140 = vshufps_avx(ZEXT416((uint)fVar123),ZEXT416((uint)fVar123),0);
      local_1520._16_16_ = auVar140;
      local_1520._0_16_ = auVar140;
      auVar149 = ZEXT3264(local_1520);
      local_1420._16_16_ = mm_lookupmask_ps._240_16_;
      local_1420._0_16_ = mm_lookupmask_ps._240_16_;
      local_13e0 = vperm2f128_avx(local_1420,mm_lookupmask_ps._0_32_,2);
      auVar121._8_4_ = 0xbf800000;
      auVar121._0_8_ = 0xbf800000bf800000;
      auVar121._12_4_ = 0xbf800000;
      auVar121._16_4_ = 0xbf800000;
      auVar121._20_4_ = 0xbf800000;
      auVar121._24_4_ = 0xbf800000;
      auVar121._28_4_ = 0xbf800000;
      auVar134._8_4_ = 0x3f800000;
      auVar134._0_8_ = &DAT_3f8000003f800000;
      auVar134._12_4_ = 0x3f800000;
      auVar134._16_4_ = 0x3f800000;
      auVar134._20_4_ = 0x3f800000;
      auVar134._24_4_ = 0x3f800000;
      auVar134._28_4_ = 0x3f800000;
      _local_1400 = vblendvps_avx(auVar134,auVar121,local_13e0);
      local_1668 = uVar108;
      local_1660 = uVar119;
      local_1658 = uVar113;
      local_1650 = uVar112;
      do {
        if (puVar114 == &local_1200) {
          return;
        }
        uVar118 = puVar114[-1];
        puVar114 = puVar114 + -1;
        do {
          if ((uVar118 & 8) == 0) {
            auVar121 = vsubps_avx(*(undefined1 (*) [32])(uVar118 + 0x40 + uVar115),auVar152._0_32_);
            auVar73._4_4_ = auVar165._4_4_ * auVar121._4_4_;
            auVar73._0_4_ = auVar165._0_4_ * auVar121._0_4_;
            auVar73._8_4_ = auVar165._8_4_ * auVar121._8_4_;
            auVar73._12_4_ = auVar165._12_4_ * auVar121._12_4_;
            auVar73._16_4_ = auVar165._16_4_ * auVar121._16_4_;
            auVar73._20_4_ = auVar165._20_4_ * auVar121._20_4_;
            auVar73._24_4_ = auVar165._24_4_ * auVar121._24_4_;
            auVar73._28_4_ = auVar121._28_4_;
            auVar121 = vsubps_avx(*(undefined1 (*) [32])(uVar118 + 0x40 + local_1610),
                                  auVar154._0_32_);
            auVar74._4_4_ = auVar174._4_4_ * auVar121._4_4_;
            auVar74._0_4_ = auVar174._0_4_ * auVar121._0_4_;
            auVar74._8_4_ = auVar174._8_4_ * auVar121._8_4_;
            auVar74._12_4_ = auVar174._12_4_ * auVar121._12_4_;
            auVar74._16_4_ = auVar174._16_4_ * auVar121._16_4_;
            auVar74._20_4_ = auVar174._20_4_ * auVar121._20_4_;
            auVar74._24_4_ = auVar174._24_4_ * auVar121._24_4_;
            auVar74._28_4_ = auVar121._28_4_;
            auVar121 = vmaxps_avx(auVar73,auVar74);
            auVar134 = vsubps_avx(*(undefined1 (*) [32])(uVar118 + 0x40 + uVar112),auVar157._0_32_);
            auVar75._4_4_ = auVar139._4_4_ * auVar134._4_4_;
            auVar75._0_4_ = auVar139._0_4_ * auVar134._0_4_;
            auVar75._8_4_ = auVar139._8_4_ * auVar134._8_4_;
            auVar75._12_4_ = auVar139._12_4_ * auVar134._12_4_;
            auVar75._16_4_ = auVar139._16_4_ * auVar134._16_4_;
            auVar75._20_4_ = auVar139._20_4_ * auVar134._20_4_;
            auVar75._24_4_ = auVar139._24_4_ * auVar134._24_4_;
            auVar75._28_4_ = auVar134._28_4_;
            auVar134 = vmaxps_avx(auVar75,auVar143._0_32_);
            auVar121 = vmaxps_avx(auVar121,auVar134);
            auVar134 = vsubps_avx(*(undefined1 (*) [32])(uVar118 + 0x40 + uVar113),auVar152._0_32_);
            auVar76._4_4_ = auVar165._4_4_ * auVar134._4_4_;
            auVar76._0_4_ = auVar165._0_4_ * auVar134._0_4_;
            auVar76._8_4_ = auVar165._8_4_ * auVar134._8_4_;
            auVar76._12_4_ = auVar165._12_4_ * auVar134._12_4_;
            auVar76._16_4_ = auVar165._16_4_ * auVar134._16_4_;
            auVar76._20_4_ = auVar165._20_4_ * auVar134._20_4_;
            auVar76._24_4_ = auVar165._24_4_ * auVar134._24_4_;
            auVar76._28_4_ = auVar134._28_4_;
            auVar134 = vsubps_avx(*(undefined1 (*) [32])(uVar118 + 0x40 + uVar119),auVar154._0_32_);
            auVar77._4_4_ = auVar174._4_4_ * auVar134._4_4_;
            auVar77._0_4_ = auVar174._0_4_ * auVar134._0_4_;
            auVar77._8_4_ = auVar174._8_4_ * auVar134._8_4_;
            auVar77._12_4_ = auVar174._12_4_ * auVar134._12_4_;
            auVar77._16_4_ = auVar174._16_4_ * auVar134._16_4_;
            auVar77._20_4_ = auVar174._20_4_ * auVar134._20_4_;
            auVar77._24_4_ = auVar174._24_4_ * auVar134._24_4_;
            auVar77._28_4_ = auVar134._28_4_;
            auVar134 = vminps_avx(auVar76,auVar77);
            auVar73 = vsubps_avx(*(undefined1 (*) [32])(uVar118 + 0x40 + uVar108),auVar157._0_32_);
            auVar86._4_4_ = auVar139._4_4_ * auVar73._4_4_;
            auVar86._0_4_ = auVar139._0_4_ * auVar73._0_4_;
            auVar86._8_4_ = auVar139._8_4_ * auVar73._8_4_;
            auVar86._12_4_ = auVar139._12_4_ * auVar73._12_4_;
            auVar86._16_4_ = auVar139._16_4_ * auVar73._16_4_;
            auVar86._20_4_ = auVar139._20_4_ * auVar73._20_4_;
            auVar86._24_4_ = auVar139._24_4_ * auVar73._24_4_;
            auVar86._28_4_ = auVar73._28_4_;
            auVar73 = vminps_avx(auVar86,auVar149._0_32_);
            auVar134 = vminps_avx(auVar134,auVar73);
            auVar121 = vcmpps_avx(auVar121,auVar134,2);
            uVar116 = vmovmskps_avx(auVar121);
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar116);
          }
          if ((uVar118 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar105 = 4;
            }
            else {
              uVar117 = uVar118 & 0xfffffffffffffff0;
              lVar109 = 0;
              if (unaff_R12 != 0) {
                for (; (unaff_R12 >> lVar109 & 1) == 0; lVar109 = lVar109 + 1) {
                }
              }
              uVar118 = *(ulong *)(uVar117 + lVar109 * 8);
              uVar111 = unaff_R12 - 1 & unaff_R12;
              if (uVar111 != 0) {
                *puVar114 = uVar118;
                lVar109 = 0;
                if (uVar111 != 0) {
                  for (; (uVar111 >> lVar109 & 1) == 0; lVar109 = lVar109 + 1) {
                  }
                }
                uVar106 = uVar111 - 1;
                while( true ) {
                  puVar114 = puVar114 + 1;
                  uVar118 = *(ulong *)(uVar117 + lVar109 * 8);
                  uVar106 = uVar106 & uVar111;
                  if (uVar106 == 0) break;
                  *puVar114 = uVar118;
                  lVar109 = 0;
                  if (uVar106 != 0) {
                    for (; (uVar106 >> lVar109 & 1) == 0; lVar109 = lVar109 + 1) {
                    }
                  }
                  uVar111 = uVar106 - 1;
                }
              }
              iVar105 = 0;
            }
          }
          else {
            iVar105 = 6;
          }
        } while (iVar105 == 0);
        if (iVar105 == 6) {
          iVar105 = 0;
          local_1608 = (ulong)((uint)uVar118 & 0xf) - 8;
          bVar120 = local_1608 != 0;
          if (bVar120) {
            uVar118 = uVar118 & 0xfffffffffffffff0;
            local_1648 = context->scene;
            uVar108 = 0;
            do {
              lVar107 = uVar108 * 0x60;
              ppfVar3 = (local_1648->vertices).items;
              pfVar4 = ppfVar3[*(uint *)(uVar118 + 0x40 + lVar107)];
              pfVar5 = ppfVar3[*(uint *)(uVar118 + 0x44 + lVar107)];
              pfVar6 = ppfVar3[*(uint *)(uVar118 + 0x48 + lVar107)];
              pfVar7 = ppfVar3[*(uint *)(uVar118 + 0x4c + lVar107)];
              auVar146 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar118 + lVar107))
                                       ,*(undefined1 (*) [16])
                                         (pfVar6 + *(uint *)(uVar118 + 8 + lVar107)));
              auVar140 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar118 + lVar107))
                                       ,*(undefined1 (*) [16])
                                         (pfVar6 + *(uint *)(uVar118 + 8 + lVar107)));
              auVar137 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar118 + 4 + lVar107)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar118 + 0xc + lVar107)));
              auVar8 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar118 + 4 + lVar107)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar118 + 0xc + lVar107)));
              auVar147 = vunpcklps_avx(auVar140,auVar8);
              auVar78 = vunpcklps_avx(auVar146,auVar137);
              auVar140 = vunpckhps_avx(auVar146,auVar137);
              auVar137 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar4 + *(uint *)(uVar118 + 0x10 + lVar107)),
                                       *(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar118 + 0x18 + lVar107)));
              auVar8 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar4 + *(uint *)(uVar118 + 0x10 + lVar107)),
                                     *(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar118 + 0x18 + lVar107)));
              auVar138 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar118 + 0x14 + lVar107)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar118 + 0x1c + lVar107)));
              auVar146 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar118 + 0x14 + lVar107)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar118 + 0x1c + lVar107)));
              auVar79 = vunpcklps_avx(auVar8,auVar146);
              auVar80 = vunpcklps_avx(auVar137,auVar138);
              auVar8 = vunpckhps_avx(auVar137,auVar138);
              auVar138 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar4 + *(uint *)(uVar118 + 0x20 + lVar107)),
                                       *(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar118 + 0x28 + lVar107)));
              auVar146 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar4 + *(uint *)(uVar118 + 0x20 + lVar107)),
                                       *(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar118 + 0x28 + lVar107)));
              auVar81 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar118 + 0x24 + lVar107)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar118 + 0x2c + lVar107)));
              auVar137 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar118 + 0x24 + lVar107)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar118 + 0x2c + lVar107)));
              auVar82 = vunpcklps_avx(auVar146,auVar137);
              auVar83 = vunpcklps_avx(auVar138,auVar81);
              auVar146 = vunpckhps_avx(auVar138,auVar81);
              auVar81 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar4 + *(uint *)(uVar118 + 0x30 + lVar107)),
                                      *(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar118 + 0x38 + lVar107)));
              auVar137 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar4 + *(uint *)(uVar118 + 0x30 + lVar107)),
                                       *(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar118 + 0x38 + lVar107)));
              auVar84 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar118 + 0x34 + lVar107)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar118 + 0x3c + lVar107)));
              auVar138 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar118 + 0x34 + lVar107)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar118 + 0x3c + lVar107)));
              auVar138 = vunpcklps_avx(auVar137,auVar138);
              auVar85 = vunpcklps_avx(auVar81,auVar84);
              auVar137 = vunpckhps_avx(auVar81,auVar84);
              lVar109 = uVar118 + 0x40 + lVar107;
              local_13a0 = *(undefined8 *)(lVar109 + 0x10);
              uStack_1398 = *(undefined8 *)(lVar109 + 0x18);
              uStack_1390 = local_13a0;
              uStack_1388 = uStack_1398;
              lVar107 = uVar118 + 0x50 + lVar107;
              local_13c0 = *(undefined8 *)(lVar107 + 0x10);
              uStack_13b8 = *(undefined8 *)(lVar107 + 0x18);
              uStack_13b0 = local_13c0;
              uStack_13a8 = uStack_13b8;
              auVar141._16_16_ = auVar83;
              auVar141._0_16_ = auVar78;
              auVar148._16_16_ = auVar146;
              auVar148._0_16_ = auVar140;
              auVar153._16_16_ = auVar82;
              auVar153._0_16_ = auVar147;
              auVar124._16_16_ = auVar80;
              auVar124._0_16_ = auVar80;
              auVar150._16_16_ = auVar8;
              auVar150._0_16_ = auVar8;
              auVar135._16_16_ = auVar79;
              auVar135._0_16_ = auVar79;
              auVar164._16_16_ = auVar85;
              auVar164._0_16_ = auVar85;
              auVar173._16_16_ = auVar137;
              auVar173._0_16_ = auVar137;
              auVar122._16_16_ = auVar138;
              auVar122._0_16_ = auVar138;
              local_1640 = vsubps_avx(auVar141,auVar124);
              local_1580 = vsubps_avx(auVar148,auVar150);
              auVar121 = vsubps_avx(auVar153,auVar135);
              auVar134 = vsubps_avx(auVar164,auVar141);
              auVar73 = vsubps_avx(auVar173,auVar148);
              auVar74 = vsubps_avx(auVar122,auVar153);
              fVar131 = auVar74._0_4_;
              fVar175 = local_1580._0_4_;
              fVar13 = auVar74._4_4_;
              fVar177 = local_1580._4_4_;
              auVar87._4_4_ = fVar177 * fVar13;
              auVar87._0_4_ = fVar175 * fVar131;
              fVar23 = auVar74._8_4_;
              fVar178 = local_1580._8_4_;
              auVar87._8_4_ = fVar178 * fVar23;
              fVar33 = auVar74._12_4_;
              fVar179 = local_1580._12_4_;
              auVar87._12_4_ = fVar179 * fVar33;
              fVar43 = auVar74._16_4_;
              fVar180 = local_1580._16_4_;
              auVar87._16_4_ = fVar180 * fVar43;
              fVar53 = auVar74._20_4_;
              fVar181 = local_1580._20_4_;
              auVar87._20_4_ = fVar181 * fVar53;
              fVar63 = auVar74._24_4_;
              fVar182 = local_1580._24_4_;
              auVar87._24_4_ = fVar182 * fVar63;
              auVar87._28_4_ = auVar138._12_4_;
              fVar132 = auVar73._0_4_;
              fVar155 = auVar121._0_4_;
              fVar14 = auVar73._4_4_;
              fVar158 = auVar121._4_4_;
              auVar89._4_4_ = fVar158 * fVar14;
              auVar89._0_4_ = fVar155 * fVar132;
              fVar24 = auVar73._8_4_;
              fVar159 = auVar121._8_4_;
              auVar89._8_4_ = fVar159 * fVar24;
              fVar34 = auVar73._12_4_;
              fVar160 = auVar121._12_4_;
              auVar89._12_4_ = fVar160 * fVar34;
              fVar44 = auVar73._16_4_;
              fVar161 = auVar121._16_4_;
              auVar89._16_4_ = fVar161 * fVar44;
              fVar54 = auVar73._20_4_;
              fVar162 = auVar121._20_4_;
              auVar89._20_4_ = fVar162 * fVar54;
              fVar64 = auVar73._24_4_;
              uVar88 = auVar80._12_4_;
              fVar163 = auVar121._24_4_;
              auVar89._24_4_ = fVar163 * fVar64;
              auVar89._28_4_ = uVar88;
              local_1540 = vsubps_avx(auVar89,auVar87);
              fVar133 = auVar134._0_4_;
              fVar15 = auVar134._4_4_;
              auVar91._4_4_ = fVar158 * fVar15;
              auVar91._0_4_ = fVar155 * fVar133;
              fVar25 = auVar134._8_4_;
              auVar91._8_4_ = fVar159 * fVar25;
              fVar35 = auVar134._12_4_;
              auVar91._12_4_ = fVar160 * fVar35;
              fVar45 = auVar134._16_4_;
              auVar91._16_4_ = fVar161 * fVar45;
              fVar55 = auVar134._20_4_;
              auVar91._20_4_ = fVar162 * fVar55;
              fVar65 = auVar134._24_4_;
              uVar90 = local_1540._28_4_;
              auVar91._24_4_ = fVar163 * fVar65;
              auVar91._28_4_ = uVar90;
              fVar144 = local_1640._0_4_;
              fVar16 = local_1640._4_4_;
              auVar92._4_4_ = fVar13 * fVar16;
              auVar92._0_4_ = fVar131 * fVar144;
              fVar26 = local_1640._8_4_;
              auVar92._8_4_ = fVar23 * fVar26;
              fVar36 = local_1640._12_4_;
              auVar92._12_4_ = fVar33 * fVar36;
              fVar46 = local_1640._16_4_;
              auVar92._16_4_ = fVar43 * fVar46;
              fVar56 = local_1640._20_4_;
              auVar92._20_4_ = fVar53 * fVar56;
              fVar66 = local_1640._24_4_;
              auVar92._24_4_ = fVar63 * fVar66;
              auVar92._28_4_ = auVar79._12_4_;
              auVar121 = vsubps_avx(auVar92,auVar91);
              auVar93._4_4_ = fVar14 * fVar16;
              auVar93._0_4_ = fVar132 * fVar144;
              auVar93._8_4_ = fVar24 * fVar26;
              auVar93._12_4_ = fVar34 * fVar36;
              auVar93._16_4_ = fVar44 * fVar46;
              auVar93._20_4_ = fVar54 * fVar56;
              auVar93._24_4_ = fVar64 * fVar66;
              auVar93._28_4_ = uVar90;
              auVar94._4_4_ = fVar177 * fVar15;
              auVar94._0_4_ = fVar175 * fVar133;
              auVar94._8_4_ = fVar178 * fVar25;
              auVar94._12_4_ = fVar179 * fVar35;
              auVar94._16_4_ = fVar180 * fVar45;
              auVar94._20_4_ = fVar181 * fVar55;
              auVar94._24_4_ = fVar182 * fVar65;
              auVar94._28_4_ = local_1580._28_4_;
              local_15a0 = vsubps_avx(auVar94,auVar93);
              uVar116 = *(undefined4 *)&(ray->org).field_0;
              auVar176._4_4_ = uVar116;
              auVar176._0_4_ = uVar116;
              auVar176._8_4_ = uVar116;
              auVar176._12_4_ = uVar116;
              auVar176._16_4_ = uVar116;
              auVar176._20_4_ = uVar116;
              auVar176._24_4_ = uVar116;
              auVar176._28_4_ = uVar116;
              uVar116 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar183._4_4_ = uVar116;
              auVar183._0_4_ = uVar116;
              auVar183._8_4_ = uVar116;
              auVar183._12_4_ = uVar116;
              auVar183._16_4_ = uVar116;
              auVar183._20_4_ = uVar116;
              auVar183._24_4_ = uVar116;
              auVar183._28_4_ = uVar116;
              uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar184._4_4_ = uVar1;
              auVar184._0_4_ = uVar1;
              auVar184._8_4_ = uVar1;
              auVar184._12_4_ = uVar1;
              auVar184._16_4_ = uVar1;
              auVar184._20_4_ = uVar1;
              auVar184._24_4_ = uVar1;
              auVar184._28_4_ = uVar1;
              fVar123 = (ray->dir).field_0.m128[1];
              local_1560 = vsubps_avx(auVar141,auVar176);
              fVar129 = (ray->dir).field_0.m128[2];
              auVar75 = vsubps_avx(auVar148,auVar183);
              auVar76 = vsubps_avx(auVar153,auVar184);
              fVar145 = auVar76._0_4_;
              fVar17 = auVar76._4_4_;
              auVar95._4_4_ = fVar123 * fVar17;
              auVar95._0_4_ = fVar123 * fVar145;
              fVar27 = auVar76._8_4_;
              auVar95._8_4_ = fVar123 * fVar27;
              fVar37 = auVar76._12_4_;
              auVar95._12_4_ = fVar123 * fVar37;
              fVar47 = auVar76._16_4_;
              auVar95._16_4_ = fVar123 * fVar47;
              fVar57 = auVar76._20_4_;
              auVar95._20_4_ = fVar123 * fVar57;
              fVar67 = auVar76._24_4_;
              auVar95._24_4_ = fVar123 * fVar67;
              auVar95._28_4_ = uVar116;
              fVar128 = auVar75._0_4_;
              fVar18 = auVar75._4_4_;
              auVar96._4_4_ = fVar129 * fVar18;
              auVar96._0_4_ = fVar129 * fVar128;
              fVar28 = auVar75._8_4_;
              auVar96._8_4_ = fVar129 * fVar28;
              fVar38 = auVar75._12_4_;
              auVar96._12_4_ = fVar129 * fVar38;
              fVar48 = auVar75._16_4_;
              auVar96._16_4_ = fVar129 * fVar48;
              fVar58 = auVar75._20_4_;
              auVar96._20_4_ = fVar129 * fVar58;
              fVar68 = auVar75._24_4_;
              auVar96._24_4_ = fVar129 * fVar68;
              auVar96._28_4_ = uVar1;
              auVar75 = vsubps_avx(auVar96,auVar95);
              fVar130 = (ray->dir).field_0.m128[0];
              fVar9 = local_1560._0_4_;
              fVar19 = local_1560._4_4_;
              auVar97._4_4_ = fVar129 * fVar19;
              auVar97._0_4_ = fVar129 * fVar9;
              fVar29 = local_1560._8_4_;
              auVar97._8_4_ = fVar129 * fVar29;
              fVar39 = local_1560._12_4_;
              auVar97._12_4_ = fVar129 * fVar39;
              fVar49 = local_1560._16_4_;
              auVar97._16_4_ = fVar129 * fVar49;
              fVar59 = local_1560._20_4_;
              auVar97._20_4_ = fVar129 * fVar59;
              fVar69 = local_1560._24_4_;
              auVar97._24_4_ = fVar129 * fVar69;
              auVar97._28_4_ = uVar90;
              auVar98._4_4_ = fVar130 * fVar17;
              auVar98._0_4_ = fVar130 * fVar145;
              auVar98._8_4_ = fVar130 * fVar27;
              auVar98._12_4_ = fVar130 * fVar37;
              auVar98._16_4_ = fVar130 * fVar47;
              auVar98._20_4_ = fVar130 * fVar57;
              auVar98._24_4_ = fVar130 * fVar67;
              auVar98._28_4_ = uVar88;
              auVar76 = vsubps_avx(auVar98,auVar97);
              auVar99._4_4_ = fVar130 * fVar18;
              auVar99._0_4_ = fVar130 * fVar128;
              auVar99._8_4_ = fVar130 * fVar28;
              auVar99._12_4_ = fVar130 * fVar38;
              auVar99._16_4_ = fVar130 * fVar48;
              auVar99._20_4_ = fVar130 * fVar58;
              auVar99._24_4_ = fVar130 * fVar68;
              auVar99._28_4_ = uVar88;
              auVar100._4_4_ = fVar123 * fVar19;
              auVar100._0_4_ = fVar123 * fVar9;
              auVar100._8_4_ = fVar123 * fVar29;
              auVar100._12_4_ = fVar123 * fVar39;
              auVar100._16_4_ = fVar123 * fVar49;
              auVar100._20_4_ = fVar123 * fVar59;
              auVar100._24_4_ = fVar123 * fVar69;
              auVar100._28_4_ = local_1560._28_4_;
              auVar77 = vsubps_avx(auVar100,auVar99);
              fVar10 = local_15a0._0_4_;
              fVar20 = local_15a0._4_4_;
              fVar30 = local_15a0._8_4_;
              fVar40 = local_15a0._12_4_;
              fVar50 = local_15a0._16_4_;
              fVar60 = local_15a0._20_4_;
              fVar70 = local_15a0._24_4_;
              fVar11 = auVar121._0_4_;
              fVar21 = auVar121._4_4_;
              fVar31 = auVar121._8_4_;
              fVar41 = auVar121._12_4_;
              fVar51 = auVar121._16_4_;
              fVar61 = auVar121._20_4_;
              fVar71 = auVar121._24_4_;
              fVar12 = local_1540._0_4_;
              fVar22 = local_1540._4_4_;
              fVar32 = local_1540._8_4_;
              fVar42 = local_1540._12_4_;
              fVar52 = local_1540._16_4_;
              fVar62 = local_1540._20_4_;
              fVar72 = local_1540._24_4_;
              auVar136._0_4_ = fVar130 * fVar12 + fVar123 * fVar11 + fVar129 * fVar10;
              auVar136._4_4_ = fVar130 * fVar22 + fVar123 * fVar21 + fVar129 * fVar20;
              auVar136._8_4_ = fVar130 * fVar32 + fVar123 * fVar31 + fVar129 * fVar30;
              auVar136._12_4_ = fVar130 * fVar42 + fVar123 * fVar41 + fVar129 * fVar40;
              auVar136._16_4_ = fVar130 * fVar52 + fVar123 * fVar51 + fVar129 * fVar50;
              auVar136._20_4_ = fVar130 * fVar62 + fVar123 * fVar61 + fVar129 * fVar60;
              auVar136._24_4_ = fVar130 * fVar72 + fVar123 * fVar71 + fVar129 * fVar70;
              auVar136._28_4_ = fVar129 + fVar129 + local_1560._28_4_;
              auVar125._8_4_ = 0x80000000;
              auVar125._0_8_ = 0x8000000080000000;
              auVar125._12_4_ = 0x80000000;
              auVar125._16_4_ = 0x80000000;
              auVar125._20_4_ = 0x80000000;
              auVar125._24_4_ = 0x80000000;
              auVar125._28_4_ = 0x80000000;
              auVar121 = vandps_avx(auVar136,auVar125);
              uVar110 = auVar121._0_4_;
              auVar151._0_4_ =
                   (float)(uVar110 ^
                          (uint)(fVar133 * auVar75._0_4_ +
                                fVar132 * auVar76._0_4_ + fVar131 * auVar77._0_4_));
              uVar166 = auVar121._4_4_;
              auVar151._4_4_ =
                   (float)(uVar166 ^
                          (uint)(fVar15 * auVar75._4_4_ +
                                fVar14 * auVar76._4_4_ + fVar13 * auVar77._4_4_));
              uVar167 = auVar121._8_4_;
              auVar151._8_4_ =
                   (float)(uVar167 ^
                          (uint)(fVar25 * auVar75._8_4_ +
                                fVar24 * auVar76._8_4_ + fVar23 * auVar77._8_4_));
              uVar168 = auVar121._12_4_;
              auVar151._12_4_ =
                   (float)(uVar168 ^
                          (uint)(fVar35 * auVar75._12_4_ +
                                fVar34 * auVar76._12_4_ + fVar33 * auVar77._12_4_));
              uVar169 = auVar121._16_4_;
              auVar151._16_4_ =
                   (float)(uVar169 ^
                          (uint)(fVar45 * auVar75._16_4_ +
                                fVar44 * auVar76._16_4_ + fVar43 * auVar77._16_4_));
              uVar170 = auVar121._20_4_;
              auVar151._20_4_ =
                   (float)(uVar170 ^
                          (uint)(fVar55 * auVar75._20_4_ +
                                fVar54 * auVar76._20_4_ + fVar53 * auVar77._20_4_));
              uVar171 = auVar121._24_4_;
              auVar151._24_4_ =
                   (float)(uVar171 ^
                          (uint)(fVar65 * auVar75._24_4_ +
                                fVar64 * auVar76._24_4_ + fVar63 * auVar77._24_4_));
              uVar172 = auVar121._28_4_;
              auVar151._28_4_ =
                   (float)(uVar172 ^ (uint)(auVar134._28_4_ + auVar73._28_4_ + auVar74._28_4_));
              auVar156._0_4_ =
                   (float)(uVar110 ^
                          (uint)(auVar75._0_4_ * fVar144 +
                                auVar76._0_4_ * fVar175 + fVar155 * auVar77._0_4_));
              auVar156._4_4_ =
                   (float)(uVar166 ^
                          (uint)(auVar75._4_4_ * fVar16 +
                                auVar76._4_4_ * fVar177 + fVar158 * auVar77._4_4_));
              auVar156._8_4_ =
                   (float)(uVar167 ^
                          (uint)(auVar75._8_4_ * fVar26 +
                                auVar76._8_4_ * fVar178 + fVar159 * auVar77._8_4_));
              auVar156._12_4_ =
                   (float)(uVar168 ^
                          (uint)(auVar75._12_4_ * fVar36 +
                                auVar76._12_4_ * fVar179 + fVar160 * auVar77._12_4_));
              auVar156._16_4_ =
                   (float)(uVar169 ^
                          (uint)(auVar75._16_4_ * fVar46 +
                                auVar76._16_4_ * fVar180 + fVar161 * auVar77._16_4_));
              auVar156._20_4_ =
                   (float)(uVar170 ^
                          (uint)(auVar75._20_4_ * fVar56 +
                                auVar76._20_4_ * fVar181 + fVar162 * auVar77._20_4_));
              auVar156._24_4_ =
                   (float)(uVar171 ^
                          (uint)(auVar75._24_4_ * fVar66 +
                                auVar76._24_4_ * fVar182 + fVar163 * auVar77._24_4_));
              auVar156._28_4_ = (float)(uVar172 ^ (uint)(auVar76._28_4_ + auVar77._28_4_ + -0.0));
              auVar134 = ZEXT1232(ZEXT412(0)) << 0x20;
              auVar121 = vcmpps_avx(auVar151,auVar134,5);
              auVar134 = vcmpps_avx(auVar156,auVar134,5);
              auVar121 = vandps_avx(auVar121,auVar134);
              auVar126._8_4_ = 0x7fffffff;
              auVar126._0_8_ = 0x7fffffff7fffffff;
              auVar126._12_4_ = 0x7fffffff;
              auVar126._16_4_ = 0x7fffffff;
              auVar126._20_4_ = 0x7fffffff;
              auVar126._24_4_ = 0x7fffffff;
              auVar126._28_4_ = 0x7fffffff;
              local_1320 = vandps_avx(auVar136,auVar126);
              auVar134 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar136,4);
              auVar121 = vandps_avx(auVar121,auVar134);
              auVar127._0_4_ = auVar156._0_4_ + auVar151._0_4_;
              auVar127._4_4_ = auVar156._4_4_ + auVar151._4_4_;
              auVar127._8_4_ = auVar156._8_4_ + auVar151._8_4_;
              auVar127._12_4_ = auVar156._12_4_ + auVar151._12_4_;
              auVar127._16_4_ = auVar156._16_4_ + auVar151._16_4_;
              auVar127._20_4_ = auVar156._20_4_ + auVar151._20_4_;
              auVar127._24_4_ = auVar156._24_4_ + auVar151._24_4_;
              auVar127._28_4_ = auVar156._28_4_ + auVar151._28_4_;
              auVar73 = vcmpps_avx(auVar127,local_1320,2);
              auVar134 = vandps_avx(auVar121,auVar73);
              auVar74 = local_1420 & auVar134;
              if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar74 >> 0x7f,0) != '\0') ||
                    (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar74 >> 0xbf,0) != '\0') ||
                  (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar74[0x1f] < '\0') {
                auVar134 = vandps_avx(auVar134,local_1420);
                local_1340._0_4_ =
                     (float)(uVar110 ^ (uint)(fVar12 * fVar9 + fVar11 * fVar128 + fVar145 * fVar10))
                ;
                local_1340._4_4_ =
                     (float)(uVar166 ^ (uint)(fVar22 * fVar19 + fVar21 * fVar18 + fVar17 * fVar20));
                local_1340._8_4_ =
                     (float)(uVar167 ^ (uint)(fVar32 * fVar29 + fVar31 * fVar28 + fVar27 * fVar30));
                local_1340._12_4_ =
                     (float)(uVar168 ^ (uint)(fVar42 * fVar39 + fVar41 * fVar38 + fVar37 * fVar40));
                local_1340._16_4_ =
                     (float)(uVar169 ^ (uint)(fVar52 * fVar49 + fVar51 * fVar48 + fVar47 * fVar50));
                local_1340._20_4_ =
                     (float)(uVar170 ^ (uint)(fVar62 * fVar59 + fVar61 * fVar58 + fVar57 * fVar60));
                local_1340._24_4_ =
                     (float)(uVar171 ^ (uint)(fVar72 * fVar69 + fVar71 * fVar68 + fVar67 * fVar70));
                local_1340._28_4_ =
                     uVar172 ^ (uint)(auVar73._28_4_ + auVar73._28_4_ + auVar121._28_4_);
                fVar123 = (ray->org).field_0.m128[3];
                fVar129 = local_1320._0_4_;
                fVar130 = local_1320._4_4_;
                auVar101._4_4_ = fVar130 * fVar123;
                auVar101._0_4_ = fVar129 * fVar123;
                fVar131 = local_1320._8_4_;
                auVar101._8_4_ = fVar131 * fVar123;
                fVar132 = local_1320._12_4_;
                auVar101._12_4_ = fVar132 * fVar123;
                fVar133 = local_1320._16_4_;
                auVar101._16_4_ = fVar133 * fVar123;
                fVar144 = local_1320._20_4_;
                auVar101._20_4_ = fVar144 * fVar123;
                fVar145 = local_1320._24_4_;
                auVar101._24_4_ = fVar145 * fVar123;
                auVar101._28_4_ = fVar123;
                auVar121 = vcmpps_avx(auVar101,local_1340,1);
                fVar123 = ray->tfar;
                auVar102._4_4_ = fVar130 * fVar123;
                auVar102._0_4_ = fVar129 * fVar123;
                auVar102._8_4_ = fVar131 * fVar123;
                auVar102._12_4_ = fVar132 * fVar123;
                auVar102._16_4_ = fVar133 * fVar123;
                auVar102._20_4_ = fVar144 * fVar123;
                auVar102._24_4_ = fVar145 * fVar123;
                auVar102._28_4_ = fVar123;
                auVar73 = vcmpps_avx(local_1340,auVar102,2);
                auVar121 = vandps_avx(auVar73,auVar121);
                auVar73 = auVar134 & auVar121;
                if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar73 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar73 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar73 >> 0x7f,0) != '\0') ||
                      (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar73 >> 0xbf,0) != '\0') ||
                    (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar73[0x1f] < '\0') {
                  local_12e0 = vandps_avx(auVar134,auVar121);
                  auVar121 = vsubps_avx(local_1320,auVar156);
                  local_1380 = vblendvps_avx(auVar151,auVar121,local_13e0);
                  auVar121 = vsubps_avx(local_1320,auVar151);
                  local_1360 = vblendvps_avx(auVar156,auVar121,local_13e0);
                  local_1260[0] = fVar12 * (float)local_1400._0_4_;
                  local_1260[1] = fVar22 * (float)local_1400._4_4_;
                  local_1260[2] = fVar32 * fStack_13f8;
                  local_1260[3] = fVar42 * fStack_13f4;
                  fStack_1250 = fVar52 * fStack_13f0;
                  fStack_124c = fVar62 * fStack_13ec;
                  fStack_1248 = fVar72 * fStack_13e8;
                  fStack_1244 = auVar156._28_4_;
                  local_1240[0] = fVar11 * (float)local_1400._0_4_;
                  local_1240[1] = fVar21 * (float)local_1400._4_4_;
                  local_1240[2] = fVar31 * fStack_13f8;
                  local_1240[3] = fVar41 * fStack_13f4;
                  fStack_1230 = fVar51 * fStack_13f0;
                  fStack_122c = fVar61 * fStack_13ec;
                  fStack_1228 = fVar71 * fStack_13e8;
                  fStack_1224 = auVar156._28_4_;
                  auVar121 = vrcpps_avx(local_1320);
                  local_1220[0] = (float)local_1400._0_4_ * fVar10;
                  local_1220[1] = (float)local_1400._4_4_ * fVar20;
                  local_1220[2] = fStack_13f8 * fVar30;
                  local_1220[3] = fStack_13f4 * fVar40;
                  fStack_1210 = fStack_13f0 * fVar50;
                  fStack_120c = fStack_13ec * fVar60;
                  fStack_1208 = fStack_13e8 * fVar70;
                  uStack_1204 = uStack_13e4;
                  fVar123 = auVar121._0_4_;
                  fVar128 = auVar121._4_4_;
                  auVar103._4_4_ = fVar130 * fVar128;
                  auVar103._0_4_ = fVar129 * fVar123;
                  fVar129 = auVar121._8_4_;
                  auVar103._8_4_ = fVar131 * fVar129;
                  fVar130 = auVar121._12_4_;
                  auVar103._12_4_ = fVar132 * fVar130;
                  fVar131 = auVar121._16_4_;
                  auVar103._16_4_ = fVar133 * fVar131;
                  fVar132 = auVar121._20_4_;
                  auVar103._20_4_ = fVar144 * fVar132;
                  fVar133 = auVar121._24_4_;
                  auVar103._24_4_ = fVar145 * fVar133;
                  auVar103._28_4_ = uStack_13e4;
                  auVar142._8_4_ = 0x3f800000;
                  auVar142._0_8_ = &DAT_3f8000003f800000;
                  auVar142._12_4_ = 0x3f800000;
                  auVar142._16_4_ = 0x3f800000;
                  auVar142._20_4_ = 0x3f800000;
                  auVar142._24_4_ = 0x3f800000;
                  auVar142._28_4_ = 0x3f800000;
                  auVar121 = vsubps_avx(auVar142,auVar103);
                  fVar123 = fVar123 + fVar123 * auVar121._0_4_;
                  fVar128 = fVar128 + fVar128 * auVar121._4_4_;
                  fVar129 = fVar129 + fVar129 * auVar121._8_4_;
                  fVar130 = fVar130 + fVar130 * auVar121._12_4_;
                  fVar131 = fVar131 + fVar131 * auVar121._16_4_;
                  fVar132 = fVar132 + fVar132 * auVar121._20_4_;
                  fVar133 = fVar133 + fVar133 * auVar121._24_4_;
                  local_1280._4_4_ = fVar128 * local_1340._4_4_;
                  local_1280._0_4_ = fVar123 * local_1340._0_4_;
                  local_1280._8_4_ = fVar129 * local_1340._8_4_;
                  local_1280._12_4_ = fVar130 * local_1340._12_4_;
                  local_1280._16_4_ = fVar131 * local_1340._16_4_;
                  local_1280._20_4_ = fVar132 * local_1340._20_4_;
                  local_1280._24_4_ = fVar133 * local_1340._24_4_;
                  local_1280._28_4_ = auVar121._28_4_;
                  local_12c0._4_4_ = local_1380._4_4_ * fVar128;
                  local_12c0._0_4_ = local_1380._0_4_ * fVar123;
                  local_12c0._8_4_ = local_1380._8_4_ * fVar129;
                  local_12c0._12_4_ = local_1380._12_4_ * fVar130;
                  local_12c0._16_4_ = local_1380._16_4_ * fVar131;
                  local_12c0._20_4_ = local_1380._20_4_ * fVar132;
                  local_12c0._24_4_ = local_1380._24_4_ * fVar133;
                  local_12c0._28_4_ = local_1380._28_4_;
                  local_12a0[0] = local_1360._0_4_ * fVar123;
                  local_12a0[1] = local_1360._4_4_ * fVar128;
                  local_12a0[2] = local_1360._8_4_ * fVar129;
                  local_12a0[3] = local_1360._12_4_ * fVar130;
                  fStack_1290 = local_1360._16_4_ * fVar131;
                  fStack_128c = local_1360._20_4_ * fVar132;
                  fStack_1288 = local_1360._24_4_ * fVar133;
                  uStack_1284 = local_1360._28_4_;
                  uVar110 = vmovmskps_avx(local_12e0);
                  uVar112 = (ulong)uVar110;
                  do {
                    local_1618 = 0;
                    if (uVar112 != 0) {
                      for (; (uVar112 >> local_1618 & 1) == 0; local_1618 = local_1618 + 1) {
                      }
                    }
                    local_15e8 = *(uint *)((long)&local_13a0 + local_1618 * 4);
                    local_1620 = (local_1648->geometries).items[local_15e8].ptr;
                    if ((local_1620->mask & ray->mask) == 0) {
                      uVar112 = uVar112 ^ 1L << (local_1618 & 0x3f);
                      bVar104 = true;
                    }
                    else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                            (local_1620->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar104 = false;
                    }
                    else {
                      local_1580._0_8_ = context->args;
                      local_1640._0_8_ = uVar112;
                      local_1560._0_8_ = uVar115;
                      local_15a0._0_8_ = puVar114;
                      local_15f4 = local_12a0[local_1618 - 8];
                      local_15f0 = local_12a0[local_1618];
                      local_1540._0_8_ = context;
                      local_15d0.context = context->user;
                      local_15ec = *(undefined4 *)((long)&local_13c0 + local_1618 * 4);
                      local_1600 = local_1260[local_1618];
                      local_15fc = local_1240[local_1618];
                      local_15f8 = local_1220[local_1618];
                      local_15e4 = (local_15d0.context)->instID[0];
                      local_15e0 = (local_15d0.context)->instPrimID[0];
                      fVar123 = ray->tfar;
                      ray->tfar = local_1260[local_1618 - 8];
                      local_166c = -1;
                      local_15d0.valid = &local_166c;
                      local_15d0.geometryUserPtr = local_1620->userPtr;
                      local_15d0.hit = (RTCHitN *)&local_1600;
                      local_15d0.N = 1;
                      local_15d0.ray = (RTCRayN *)ray;
                      if ((local_1620->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*local_1620->occlusionFilterN)(&local_15d0), *local_15d0.valid != 0)) {
                        if (*(code **)(local_1580._0_8_ + 0x10) != (code *)0x0) {
                          if (((*(byte *)local_1580._0_8_ & 2) != 0) ||
                             (((local_1620->field_8).field_0x2 & 0x40) != 0)) {
                            (**(code **)(local_1580._0_8_ + 0x10))(&local_15d0);
                          }
                          if (*local_15d0.valid == 0) goto LAB_0030b590;
                        }
                        bVar104 = false;
                      }
                      else {
LAB_0030b590:
                        ray->tfar = fVar123;
                        local_1640._0_8_ = local_1640._0_8_ ^ 1L << (local_1618 & 0x3f);
                        bVar104 = true;
                      }
                      uVar112 = local_1640._0_8_;
                      context = (RayQueryContext *)local_1540._0_8_;
                      puVar114 = (ulong *)local_15a0._0_8_;
                      uVar115 = local_1560._0_8_;
                    }
                    if (!bVar104) {
                      auVar152 = ZEXT3264(local_1440);
                      auVar154 = ZEXT3264(local_1460);
                      auVar157 = ZEXT3264(local_1480);
                      auVar165 = ZEXT3264(local_14a0);
                      auVar174 = ZEXT3264(local_14c0);
                      auVar139 = ZEXT3264(local_14e0);
                      auVar143 = ZEXT3264(local_1500);
                      auVar149 = ZEXT3264(local_1520);
                      iVar105 = 0;
                      uVar108 = local_1668;
                      uVar112 = local_1650;
                      uVar113 = local_1658;
                      uVar119 = local_1660;
                      if (bVar120) {
                        ray->tfar = -INFINITY;
                        iVar105 = 3;
                      }
                      goto LAB_0030b648;
                    }
                  } while (uVar112 != 0);
                }
              }
              uVar108 = uVar108 + 1;
              bVar120 = uVar108 < local_1608;
            } while (uVar108 != local_1608);
            auVar152 = ZEXT3264(local_1440);
            auVar154 = ZEXT3264(local_1460);
            auVar157 = ZEXT3264(local_1480);
            auVar165 = ZEXT3264(local_14a0);
            auVar174 = ZEXT3264(local_14c0);
            auVar139 = ZEXT3264(local_14e0);
            auVar143 = ZEXT3264(local_1500);
            auVar149 = ZEXT3264(local_1520);
            iVar105 = 0;
            uVar108 = local_1668;
            uVar112 = local_1650;
            uVar113 = local_1658;
            uVar119 = local_1660;
          }
        }
LAB_0030b648:
      } while (iVar105 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }